

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O0

void __thiscall pg::TLQSolver::solve(TLQSolver *this,bitset *SG,int vtop,int pe,int po)

{
  uint uVar1;
  uint uVar2;
  uint v_25;
  unsigned_long *__first;
  bitset *this_00;
  bitset *x;
  bool bVar3;
  bool bVar4;
  uint pl_00;
  uint uVar5;
  ostream *poVar6;
  size_type sVar7;
  size_type sVar8;
  size_t sVar9;
  uint *puVar10;
  void *this_01;
  bitset *this_02;
  long lVar11;
  reference piVar12;
  reference ppbVar13;
  int iVar14;
  _label_vertex _Var15;
  bool local_c6a;
  bool local_c3a;
  bool local_bea;
  byte local_bc2;
  byte local_b9a;
  bool local_b5b;
  byte local_b22;
  bool local_af2;
  bool local_ac2;
  bool local_a72;
  byte local_a4a;
  byte local_a22;
  bitset *local_9d0;
  bitset *local_9c0;
  bitset *local_918;
  bitset *local_910;
  bool local_82a;
  bitset *local_820;
  _label_vertex local_7d0;
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [28];
  int v_24;
  int local_790;
  _label_vertex local_788;
  undefined1 local_778 [16];
  undefined1 local_768 [28];
  int v_23;
  int local_748;
  _label_vertex local_740;
  Game *local_730;
  int local_728;
  _label_vertex local_720;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [28];
  int v_22;
  int local_6d0;
  _label_vertex local_6c8;
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [28];
  int v_21;
  int local_678;
  _label_vertex local_670;
  undefined1 local_660 [16];
  undefined1 local_650 [24];
  undefined1 local_638 [4];
  int v_20;
  uint local_624;
  undefined1 local_620 [4];
  int v_19;
  undefined1 local_610 [28];
  int v_18;
  bool opponent_attracted_from_us;
  value_type pbStack_5f0;
  undefined1 local_5e8 [8];
  bitset R;
  _label_vertex local_5b8;
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [28];
  int v_17;
  int local_568;
  _label_vertex local_560;
  undefined1 local_550 [16];
  undefined1 local_540 [28];
  int v_16;
  int local_520;
  _label_vertex local_518;
  undefined1 local_508 [16];
  undefined1 local_4f8 [28];
  int v_15;
  int local_4d8;
  _label_vertex local_4d0;
  Game *local_4c0;
  int local_4b8;
  _label_vertex local_4b0;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [28];
  int v_14;
  int local_460;
  _label_vertex local_458;
  undefined1 local_448 [16];
  undefined1 local_438 [28];
  int v_13;
  int local_418;
  _label_vertex local_410;
  undefined1 local_400 [16];
  undefined1 local_3f0 [28];
  int v_12;
  int local_3d0;
  _label_vertex local_3c8;
  size_t local_3b8;
  size_t v_11;
  size_t sStack_3a8;
  int u_3;
  size_t v_10;
  int local_398;
  _label_vertex local_390;
  size_t local_380;
  size_t v_9;
  int local_370;
  _label_vertex local_368;
  size_t local_358;
  size_t v_8;
  size_t sStack_348;
  int u_2;
  size_t v_7;
  undefined1 local_320 [8];
  bitset SG_1;
  undefined1 local_2e0 [8];
  bitset k_U;
  bitset *k_H;
  bitset *k_R;
  int k_pl;
  int k_pr;
  uint k;
  int u_1;
  size_t v_6;
  uint D;
  uint T;
  int v_5;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  iterator iStack_268;
  int v_4;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  bool leaky;
  _label_vertex local_238;
  Game *local_228;
  int local_220;
  _label_vertex local_218;
  size_t local_208;
  size_t v_3;
  undefined1 local_1f8 [4];
  int u;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [24];
  int v_2;
  bitset *local_1b8;
  undefined1 local_1b0 [8];
  bitset H;
  bitset *Wo;
  bitset *Wm;
  int pl;
  int pr;
  size_t size;
  bitset local_158;
  _label_vertex local_138;
  undefined1 local_128 [28];
  int v_1;
  int local_108;
  _label_vertex local_100;
  undefined1 local_f0 [24];
  int v;
  int po_local;
  int pe_local;
  int vtop_local;
  bitset *SG_local;
  TLQSolver *this_local;
  uintqueue *local_b8;
  uint local_ac;
  uintqueue *local_a8;
  uint local_9c;
  uintqueue *local_98;
  uint local_8c;
  uintqueue *local_88;
  uint local_7c;
  uintqueue *local_78;
  uintqueue *local_70;
  uintqueue *local_68;
  uintqueue *local_60;
  uintqueue *local_58;
  uintqueue *local_50;
  uintqueue *local_48;
  uintqueue *local_40;
  uintqueue *local_38;
  uintqueue *local_30;
  uintqueue *local_28;
  uintqueue *local_20;
  char local_11;
  bitset *local_10;
  
  this->iterations = this->iterations + 1;
  local_f0._20_4_ = po;
  v = pe;
  po_local = vtop;
  _pe_local = SG;
  SG_local = (bitset *)this;
  if (po < 1) {
    bitset::operator|=(&this->W0,SG);
    if ((1 < (this->super_Solver).trace) && (bVar3 = bitset::any(_pe_local), bVar3)) {
      std::operator<<((this->super_Solver).logger,"presumed won by player 0:");
      for (local_f0._16_4_ = po_local; -1 < (int)local_f0._16_4_;
          local_f0._16_4_ = local_f0._16_4_ + -1) {
        bitset::operator[]((bitset *)local_f0,(size_t)_pe_local);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_f0);
        if (bVar3) {
          poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
          _Var15 = Solver::label_vertex(&this->super_Solver,local_f0._16_4_);
          register0x00000000 = _Var15.g;
          local_108 = _Var15.v;
          local_100.g = register0x00000000;
          local_100.v = local_108;
          poVar6 = operator<<(poVar6,&local_100);
          std::operator<<(poVar6,"\x1b[m");
        }
      }
      std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
    }
  }
  else if (pe < 1) {
    bitset::operator|=(&this->W1,SG);
    if ((1 < (this->super_Solver).trace) && (bVar3 = bitset::any(_pe_local), bVar3)) {
      std::operator<<((this->super_Solver).logger,"presumed won by player 1:");
      for (local_128._20_4_ = po_local; -1 < (int)local_128._20_4_;
          local_128._20_4_ = local_128._20_4_ + -1) {
        bitset::operator[]((bitset *)local_128,(size_t)_pe_local);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_128);
        if (bVar3) {
          poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
          _Var15 = Solver::label_vertex(&this->super_Solver,local_128._20_4_);
          local_158._bitssize = (size_t)_Var15.g;
          local_158._allocsize._0_4_ = _Var15.v;
          local_138.g = (Game *)local_158._bitssize;
          local_138.v = (int)local_158._allocsize;
          poVar6 = operator<<(poVar6,&local_138);
          std::operator<<(poVar6,"\x1b[m");
        }
      }
      std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    bitset::operator[](&local_158,(size_t)SG);
    bVar3 = bitset::reference::operator_cast_to_bool((reference *)&local_158);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      sVar9 = bitset::find_prev(_pe_local,(long)po_local);
      po_local = (int)sVar9;
      if (po_local == -1) {
        return;
      }
    }
    sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->Ps);
    sVar8 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::size(&this->Rs);
    if (sVar7 < sVar8) {
      size._4_4_ = Solver::priority(&this->super_Solver,po_local);
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->Ps,(value_type_conflict *)((long)&size + 4));
      sVar9 = bitset::count(_pe_local);
      for (; sVar9 < (ulong)(long)((int)local_f0._20_4_ / 2);
          local_f0._20_4_ = (int)local_f0._20_4_ / 2) {
      }
      for (; sVar9 < (ulong)(long)(v / 2); v = v / 2) {
      }
    }
    puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::back(&this->Ps);
    uVar1 = *puVar10;
    pl_00 = uVar1 & 1;
    if (pl_00 == 0) {
      solve(this,_pe_local,po_local,v,(int)local_f0._20_4_ / 2);
    }
    else {
      solve(this,_pe_local,po_local,v / 2,local_f0._20_4_);
    }
    if (1 < (this->super_Solver).trace) {
      poVar6 = std::operator<<((this->super_Solver).logger,"in pr=");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
      poVar6 = std::operator<<(poVar6,", pe=");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,v);
      poVar6 = std::operator<<(poVar6,", po=");
      this_01 = (void *)std::ostream::operator<<(poVar6,local_f0._20_4_);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
    if (pl_00 == 0) {
      this_02 = &this->W0;
      local_820 = &this->W1;
    }
    else {
      this_02 = &this->W1;
      local_820 = &this->W0;
    }
    bitset::operator[]((bitset *)&H._allocsize,(size_t)_pe_local);
    bVar3 = bitset::reference::operator_cast_to_bool((reference *)&H._allocsize);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      sVar9 = bitset::find_prev(_pe_local,(long)po_local);
      po_local = (int)sVar9;
      if (po_local == -1) {
        return;
      }
    }
    sVar9 = Solver::nodecount(&this->super_Solver);
    bitset::bitset((bitset *)local_1b0,sVar9);
    local_1b8 = (bitset *)local_1b0;
    std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::push_back(&this->Hs,&local_1b8);
    for (local_1d8._16_4_ = po_local; local_1d8._16_4_ != 0xffffffff;
        local_1d8._16_4_ = local_1d8._16_4_ - 1) {
      bitset::operator[]((bitset *)local_1d8,(size_t)_pe_local);
      bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_1d8);
      local_82a = true;
      if (bVar3) {
        bitset::operator[]((bitset *)local_1e8,(size_t)local_1b0);
        local_82a = bitset::reference::operator_cast_to_bool((reference *)local_1e8);
      }
      if (local_82a == false) {
        uVar5 = Solver::priority(&this->super_Solver,local_1d8._16_4_);
        if ((uVar5 & 1) != pl_00) break;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->heads,(value_type_conflict *)(local_1d8 + 0x10));
        bitset::operator[]((bitset *)local_1f8,(size_t)local_1b0);
        bitset::reference::operator=((reference *)local_1f8,true);
        this->str[(int)local_1d8._16_4_] = -1;
        local_78 = &this->Q;
        local_7c = local_1d8._16_4_;
        iVar14 = (this->Q).pointer;
        (this->Q).pointer = iVar14 + 1;
        local_78->queue[iVar14] = local_1d8._16_4_;
        while (local_48 = &this->Q, (this->Q).pointer != 0) {
          local_20 = &this->Q;
          iVar14 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar14;
          v_3._4_4_ = local_20->queue[iVar14];
          attractVertices(this,pl_00,v_3._4_4_,(bitset *)local_1b0,_pe_local,_pe_local);
          attractTangles(this,pl_00,v_3._4_4_,_pe_local,(bitset *)local_1b0,_pe_local);
        }
      }
    }
    if ((this->super_Solver).trace != 0) {
      poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion \x1b[36m");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
      std::operator<<(poVar6,"\x1b[m");
      for (local_208 = bitset::find_last((bitset *)local_1b0); local_208 != 0xffffffffffffffff;
          local_208 = bitset::find_prev((bitset *)local_1b0,local_208)) {
        poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
        _Var15 = Solver::label_vertex(&this->super_Solver,(int)local_208);
        local_228 = _Var15.g;
        local_220 = _Var15.v;
        local_218.g = local_228;
        local_218.v = local_220;
        poVar6 = operator<<(poVar6,&local_218);
        std::operator<<(poVar6,"\x1b[m");
        if (1 < (this->super_Solver).trace) {
          uVar5 = Solver::owner(&this->super_Solver,(int)local_208);
          if (uVar5 == pl_00) {
            if (this->str[local_208] == -1) {
              std::operator<<((this->super_Solver).logger,
                              "\x1b[38;5;37m\x1b[33m=>\x1b[38;5;37m-\x1b[m");
            }
            else {
              poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[33m=>\x1b[38;5;37m =>");
              _Var15 = Solver::label_vertex(&this->super_Solver,this->str[local_208]);
              local_238.g = _Var15.g;
              local_238.v = _Var15.v;
              poVar6 = operator<<(poVar6,&local_238);
              std::operator<<(poVar6,"\x1b[m");
            }
          }
        }
      }
      std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
    }
    bVar3 = false;
    __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->heads);
    iStack_268 = std::vector<int,_std::allocator<int>_>::end(&this->heads);
    while (bVar4 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffd98), bVar4) {
      piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1);
      __range2._4_4_ = *piVar12;
      bVar4 = attracts(this,pl_00,__range2._4_4_,(bitset *)local_1b0,_pe_local);
      if (!bVar4) {
        bVar3 = true;
        break;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1);
    }
    if (!bVar3) {
      puVar10 = this->pea_vidx;
      lVar11 = Solver::nodecount(&this->super_Solver);
      __range2._3_1_ = 0;
      std::fill<unsigned_int*,char>(puVar10,puVar10 + lVar11,(char *)((long)&__range2 + 3));
      this->pea_curidx = 1;
      __end2 = std::vector<int,_std::allocator<int>_>::begin(&this->heads);
      _T = std::vector<int,_std::allocator<int>_>::end(&this->heads);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&T), bVar3) {
        piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end2);
        uVar5 = this->tangles;
        uVar2 = this->dominions;
        extractTangles(this,*piVar12,(bitset *)local_1b0);
        if (uVar2 != this->dominions) {
          for (_k = bitset::find_last(&this->S); _k != 0xffffffffffffffff;
              _k = bitset::find_prev(&this->S,_k)) {
            local_88 = &this->Q;
            local_8c = (uint)_k;
            iVar14 = (this->Q).pointer;
            (this->Q).pointer = iVar14 + 1;
            local_88->queue[iVar14] = local_8c;
          }
          while (local_50 = &this->Q, (this->Q).pointer != 0) {
            local_28 = &this->Q;
            iVar14 = (this->Q).pointer + -1;
            (this->Q).pointer = iVar14;
            v_25 = local_28->queue[iVar14];
            attractVertices(this,pl_00,v_25,&this->S,&this->G,&this->G);
            attractTangles(this,pl_00,v_25,&this->G,&this->S,&this->G);
          }
          bitset::operator|=(this_02,&this->S);
          bitset::operator-=(local_820,&this->S);
          bitset::operator-=(&this->G,&this->S);
          local_10 = &this->S;
          __first = local_10->_bits;
          sVar9 = bitset::num_blocks(local_10);
          local_11 = '\0';
          std::fill<unsigned_long*,char>(__first,__first + sVar9,&local_11);
        }
        if ((uVar2 != this->dominions) || (uVar5 != this->tangles)) {
          for (k_pl = 0;
              sVar7 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::size(&this->Rs),
              (uint)k_pl < sVar7; k_pl = k_pl + 1) {
            puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                        (&this->Ps,(ulong)(uint)k_pl);
            uVar5 = *puVar10 & 1;
            ppbVar13 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                 (&this->Rs,(ulong)(uint)k_pl);
            this_00 = *ppbVar13;
            ppbVar13 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                 (&this->Hs,(ulong)(uint)k_pl);
            k_U._allocsize = (size_t)*ppbVar13;
            bitset::bitset((bitset *)local_2e0);
            if (k_pl == 0) {
              bitset::operator&=(this_00,&this->G);
              pg::operator-((bitset *)&SG_1._allocsize,&this->G,this_00);
              bitset::operator=((bitset *)local_2e0,(bitset *)&SG_1._allocsize);
              bitset::~bitset((bitset *)&SG_1._allocsize);
            }
            else {
              ppbVar13 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                   (&this->Rs,(ulong)(k_pl - 1));
              x = *ppbVar13;
              ppbVar13 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                   (&this->Hs,(ulong)(k_pl - 1));
              pg::operator-((bitset *)local_320,x,*ppbVar13);
              bitset::operator&=(this_00,(bitset *)local_320);
              pg::operator-((bitset *)&v_7,(bitset *)local_320,this_00);
              bitset::operator=((bitset *)local_2e0,(bitset *)&v_7);
              bitset::~bitset((bitset *)&v_7);
              bitset::~bitset((bitset *)local_320);
            }
            for (sStack_348 = bitset::find_last((bitset *)local_2e0);
                sStack_348 != 0xffffffffffffffff;
                sStack_348 = bitset::find_prev((bitset *)local_2e0,sStack_348)) {
              local_98 = &this->Q;
              local_9c = (uint)sStack_348;
              iVar14 = (this->Q).pointer;
              (this->Q).pointer = iVar14 + 1;
              local_98->queue[iVar14] = local_9c;
            }
            while (local_58 = &this->Q, (this->Q).pointer != 0) {
              local_30 = &this->Q;
              iVar14 = (this->Q).pointer + -1;
              (this->Q).pointer = iVar14;
              v_8._4_4_ = local_30->queue[iVar14];
              attractVertices(this,1 - uVar5,v_8._4_4_,(bitset *)local_2e0,this_00,this_00);
              attractTangles(this,1 - uVar5,v_8._4_4_,this_00,(bitset *)local_2e0,this_00);
            }
            bitset::operator-=(this_00,(bitset *)local_2e0);
            if (uVar5 == 1) {
              local_910 = &this->W0;
            }
            else {
              local_910 = &this->W1;
            }
            bitset::operator|=(local_910,(bitset *)local_2e0);
            if (uVar5 == 1) {
              local_918 = &this->W1;
            }
            else {
              local_918 = &this->W0;
            }
            bitset::operator-=(local_918,(bitset *)local_2e0);
            if (1 < (this->super_Solver).trace) {
              poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mlevel ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,k_pl);
              std::operator<<(poVar6,"-R\x1b[m");
              for (local_358 = bitset::find_last(this_00); local_358 != 0xffffffffffffffff;
                  local_358 = bitset::find_prev(this_00,local_358)) {
                poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
                _Var15 = Solver::label_vertex(&this->super_Solver,(int)local_358);
                v_9 = (size_t)_Var15.g;
                local_370 = _Var15.v;
                local_368.g = (Game *)v_9;
                local_368.v = local_370;
                poVar6 = operator<<(poVar6,&local_368);
                std::operator<<(poVar6,"\x1b[m");
              }
              std::ostream::operator<<
                        ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
            }
            if (1 < (this->super_Solver).trace) {
              poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mlevel ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,k_pl);
              std::operator<<(poVar6,"-U\x1b[m");
              for (local_380 = bitset::find_last((bitset *)local_2e0);
                  local_380 != 0xffffffffffffffff;
                  local_380 = bitset::find_prev((bitset *)local_2e0,local_380)) {
                poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
                _Var15 = Solver::label_vertex(&this->super_Solver,(int)local_380);
                v_10 = (size_t)_Var15.g;
                local_398 = _Var15.v;
                local_390.g = (Game *)v_10;
                local_390.v = local_398;
                poVar6 = operator<<(poVar6,&local_390);
                std::operator<<(poVar6,"\x1b[m");
              }
              std::ostream::operator<<
                        ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
            }
            bitset::operator&=((bitset *)k_U._allocsize,this_00);
            for (sStack_3a8 = bitset::find_last((bitset *)k_U._allocsize);
                sStack_3a8 != 0xffffffffffffffff;
                sStack_3a8 = bitset::find_prev((bitset *)k_U._allocsize,sStack_3a8)) {
              local_a8 = &this->Q;
              local_ac = (uint)sStack_3a8;
              iVar14 = (this->Q).pointer;
              (this->Q).pointer = iVar14 + 1;
              local_a8->queue[iVar14] = local_ac;
            }
            while (local_60 = &this->Q, (this->Q).pointer != 0) {
              local_38 = &this->Q;
              iVar14 = (this->Q).pointer + -1;
              (this->Q).pointer = iVar14;
              v_11._4_4_ = local_38->queue[iVar14];
              attractVertices(this,uVar5,v_11._4_4_,(bitset *)k_U._allocsize,this_00,this_00);
              attractTangles(this,uVar5,v_11._4_4_,this_00,(bitset *)k_U._allocsize,this_00);
            }
            if (uVar5 == 1) {
              local_9c0 = &this->W1;
            }
            else {
              local_9c0 = &this->W0;
            }
            bitset::operator|=(local_9c0,(bitset *)k_U._allocsize);
            if (uVar5 == 1) {
              local_9d0 = &this->W0;
            }
            else {
              local_9d0 = &this->W1;
            }
            bitset::operator-=(local_9d0,(bitset *)k_U._allocsize);
            if (1 < (this->super_Solver).trace) {
              poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mlevel ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,k_pl);
              std::operator<<(poVar6,"-H\x1b[m");
              for (local_3b8 = bitset::find_last((bitset *)k_U._allocsize);
                  local_3b8 != 0xffffffffffffffff;
                  local_3b8 = bitset::find_prev((bitset *)k_U._allocsize,local_3b8)) {
                poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
                _Var15 = Solver::label_vertex(&this->super_Solver,(int)local_3b8);
                register0x00000000 = _Var15.g;
                local_3d0 = _Var15.v;
                local_3c8.g = register0x00000000;
                local_3c8.v = local_3d0;
                poVar6 = operator<<(poVar6,&local_3c8);
                std::operator<<(poVar6,"\x1b[m");
              }
              std::ostream::operator<<
                        ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
            }
            bitset::~bitset((bitset *)local_2e0);
          }
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2);
      }
    }
    std::vector<int,_std::allocator<int>_>::clear(&this->heads);
    bitset::operator-=(this_02,_pe_local);
    if (1 < (this->super_Solver).trace) {
      poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mpre subgame \x1b[36m");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
      std::operator<<(poVar6,"\x1b[m");
      for (local_3f0._20_4_ = po_local; -1 < (int)local_3f0._20_4_;
          local_3f0._20_4_ = local_3f0._20_4_ + -1) {
        bitset::operator[]((bitset *)local_3f0,(size_t)local_1b0);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_3f0);
        local_a22 = 0;
        if (bVar3) {
          bitset::operator[]((bitset *)local_400,(size_t)local_820);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_400);
          local_a22 = bVar3 ^ 0xff;
        }
        if ((local_a22 & 1) != 0) {
          poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;46m");
          _Var15 = Solver::label_vertex(&this->super_Solver,local_3f0._20_4_);
          register0x00000000 = _Var15.g;
          local_418 = _Var15.v;
          local_410.g = register0x00000000;
          local_410.v = local_418;
          poVar6 = operator<<(poVar6,&local_410);
          std::operator<<(poVar6,"\x1b[m");
        }
      }
      std::operator<<((this->super_Solver).logger," |");
      for (local_438._20_4_ = po_local; -1 < (int)local_438._20_4_;
          local_438._20_4_ = local_438._20_4_ + -1) {
        bitset::operator[]((bitset *)local_438,(size_t)_pe_local);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_438);
        local_a4a = 0;
        if (bVar3) {
          bitset::operator[]((bitset *)local_448,(size_t)local_1b0);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_448);
          local_a4a = bVar3 ^ 0xff;
        }
        if ((local_a4a & 1) != 0) {
          poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
          _Var15 = Solver::label_vertex(&this->super_Solver,local_438._20_4_);
          register0x00000000 = _Var15.g;
          local_460 = _Var15.v;
          local_458.g = register0x00000000;
          local_458.v = local_460;
          poVar6 = operator<<(poVar6,&local_458);
          std::operator<<(poVar6,"\x1b[m");
        }
      }
      std::operator<<((this->super_Solver).logger," |");
      for (local_480._20_4_ = po_local; -1 < (int)local_480._20_4_;
          local_480._20_4_ = local_480._20_4_ + -1) {
        bitset::operator[]((bitset *)local_480,(size_t)_pe_local);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_480);
        local_a72 = false;
        if (bVar3) {
          bitset::operator[]((bitset *)local_490,(size_t)local_820);
          local_a72 = bitset::reference::operator_cast_to_bool((reference *)local_490);
        }
        if (local_a72 != false) {
          bitset::operator[]((bitset *)local_4a0,(size_t)this_02);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_4a0);
          if (bVar3) {
            poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;202m");
            _Var15 = Solver::label_vertex(&this->super_Solver,local_480._20_4_);
            local_4c0 = _Var15.g;
            local_4b8 = _Var15.v;
            local_4b0.g = local_4c0;
            local_4b0.v = local_4b8;
            poVar6 = operator<<(poVar6,&local_4b0);
            std::operator<<(poVar6,"\x1b[m");
          }
          else {
            poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;196m");
            _Var15 = Solver::label_vertex(&this->super_Solver,local_480._20_4_);
            register0x00000000 = _Var15.g;
            local_4d8 = _Var15.v;
            local_4d0.g = register0x00000000;
            local_4d0.v = local_4d8;
            poVar6 = operator<<(poVar6,&local_4d0);
            std::operator<<(poVar6,"\x1b[m");
          }
        }
      }
      std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
      std::operator<<((this->super_Solver).logger,"\x1b[1;33mgame");
      lVar11 = Solver::nodecount(&this->super_Solver);
      local_4f8._20_4_ = (undefined4)lVar11;
      while (local_4f8._20_4_ = local_4f8._20_4_ + -1, -1 < (int)local_4f8._20_4_) {
        bitset::operator[]((bitset *)local_4f8,(size_t)&this->G);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_4f8);
        local_ac2 = false;
        if (bVar3) {
          bitset::operator[]((bitset *)local_508,(size_t)&this->W0);
          local_ac2 = bitset::reference::operator_cast_to_bool((reference *)local_508);
        }
        if (local_ac2 != false) {
          poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;202m");
          _Var15 = Solver::label_vertex(&this->super_Solver,local_4f8._20_4_);
          register0x00000000 = _Var15.g;
          local_520 = _Var15.v;
          local_518.g = register0x00000000;
          local_518.v = local_520;
          poVar6 = operator<<(poVar6,&local_518);
          std::operator<<(poVar6,"\x1b[m");
        }
      }
      std::operator<<((this->super_Solver).logger," |");
      lVar11 = Solver::nodecount(&this->super_Solver);
      local_540._20_4_ = (undefined4)lVar11;
      while (local_540._20_4_ = local_540._20_4_ + -1, -1 < (int)local_540._20_4_) {
        bitset::operator[]((bitset *)local_540,(size_t)&this->G);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_540);
        local_af2 = false;
        if (bVar3) {
          bitset::operator[]((bitset *)local_550,(size_t)&this->W1);
          local_af2 = bitset::reference::operator_cast_to_bool((reference *)local_550);
        }
        if (local_af2 != false) {
          poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;201m");
          _Var15 = Solver::label_vertex(&this->super_Solver,local_540._20_4_);
          register0x00000000 = _Var15.g;
          local_568 = _Var15.v;
          local_560.g = register0x00000000;
          local_560.v = local_568;
          poVar6 = operator<<(poVar6,&local_560);
          std::operator<<(poVar6,"\x1b[m");
        }
      }
      std::operator<<((this->super_Solver).logger," |");
      lVar11 = Solver::nodecount(&this->super_Solver);
      local_588._20_4_ = (undefined4)lVar11;
      while (local_588._20_4_ = local_588._20_4_ + -1, -1 < (int)local_588._20_4_) {
        bitset::operator[]((bitset *)local_588,(size_t)&this->G);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_588);
        local_b22 = 0;
        if (bVar3) {
          bitset::operator[]((bitset *)local_598,(size_t)&this->W0);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_598);
          local_b22 = 0;
          if (!bVar3) {
            bitset::operator[]((bitset *)local_5a8,(size_t)&this->W1);
            bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_5a8);
            local_b22 = bVar3 ^ 0xff;
          }
        }
        if ((local_b22 & 1) != 0) {
          poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
          _Var15 = Solver::label_vertex(&this->super_Solver,local_588._20_4_);
          R._allocsize = (size_t)_Var15.g;
          local_5b8.v = _Var15.v;
          local_5b8.g = (Game *)R._allocsize;
          poVar6 = operator<<(poVar6,&local_5b8);
          std::operator<<(poVar6,"\x1b[m");
        }
      }
      std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
    }
    operator^((bitset *)local_5e8,_pe_local,(bitset *)local_1b0);
    bVar3 = bitset::any((bitset *)local_5e8);
    if (bVar3) {
      pbStack_5f0 = (value_type)local_5e8;
      std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::push_back
                (&this->Rs,&stack0xfffffffffffffa10);
      solve(this,(bitset *)local_5e8,po_local,v,local_f0._20_4_);
      std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::pop_back(&this->Rs);
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->Ps);
      sVar8 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::size(&this->Rs);
      if (sVar8 < sVar7) {
        std::vector<int,_std::allocator<int>_>::pop_back(&this->Ps);
      }
    }
    std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::pop_back(&this->Hs);
    bVar3 = bitset::none(_pe_local);
    if (bVar3) {
      v_18 = 1;
    }
    else {
      local_610[0x1b] = 0;
      for (local_610._20_4_ = 0; (int)local_610._20_4_ <= po_local;
          local_610._20_4_ = local_610._20_4_ + 1) {
        bitset::operator[]((bitset *)local_610,(size_t)_pe_local);
        bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_610);
        local_b5b = false;
        if (bVar3) {
          bitset::operator[]((bitset *)local_620,(size_t)local_820);
          local_b5b = bitset::reference::operator_cast_to_bool((reference *)local_620);
        }
        if (local_b5b != false) {
          local_b8 = &this->Q;
          this_local._4_4_ = local_610._20_4_;
          iVar14 = (this->Q).pointer;
          (this->Q).pointer = iVar14 + 1;
          local_b8->queue[iVar14] = local_610._20_4_;
        }
      }
      local_68 = &this->Q;
      if ((this->Q).pointer != 0) {
        while (local_70 = &this->Q, (this->Q).pointer != 0) {
          local_40 = &this->Q;
          iVar14 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar14;
          local_624 = local_40->queue[iVar14];
          bitset::operator[]((bitset *)local_638,(size_t)this_02);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_638);
          if (bVar3) {
            local_610[0x1b] = 1;
          }
          attractVertices(this,1 - pl_00,local_624,local_820,_pe_local,_pe_local);
          attractTangles(this,1 - pl_00,local_624,_pe_local,local_820,_pe_local);
        }
      }
      if (1 < (this->super_Solver).trace) {
        poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mpost subgame \x1b[36m");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
        poVar6 = std::operator<<(poVar6,"\x1b[m (pe=");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,v);
        poVar6 = std::operator<<(poVar6," po=");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_f0._20_4_);
        std::operator<<(poVar6,")");
        for (local_650._20_4_ = po_local; -1 < (int)local_650._20_4_;
            local_650._20_4_ = local_650._20_4_ + -1) {
          bitset::operator[]((bitset *)local_650,(size_t)local_1b0);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_650);
          local_b9a = 0;
          if (bVar3) {
            bitset::operator[]((bitset *)local_660,(size_t)local_820);
            bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_660);
            local_b9a = bVar3 ^ 0xff;
          }
          if ((local_b9a & 1) != 0) {
            poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
            _Var15 = Solver::label_vertex(&this->super_Solver,local_650._20_4_);
            register0x00000000 = _Var15.g;
            local_678 = _Var15.v;
            local_670.g = register0x00000000;
            local_670.v = local_678;
            poVar6 = operator<<(poVar6,&local_670);
            std::operator<<(poVar6,"\x1b[m");
          }
        }
        std::operator<<((this->super_Solver).logger," |");
        for (local_698._20_4_ = po_local; -1 < (int)local_698._20_4_;
            local_698._20_4_ = local_698._20_4_ + -1) {
          bitset::operator[]((bitset *)local_698,(size_t)_pe_local);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_698);
          local_bc2 = 0;
          if (bVar3) {
            bitset::operator[]((bitset *)local_6a8,(size_t)local_1b0);
            bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_6a8);
            local_bc2 = 0;
            if (!bVar3) {
              bitset::operator[]((bitset *)local_6b8,(size_t)local_820);
              bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_6b8);
              local_bc2 = bVar3 ^ 0xff;
            }
          }
          if ((local_bc2 & 1) != 0) {
            poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;46m");
            _Var15 = Solver::label_vertex(&this->super_Solver,local_698._20_4_);
            register0x00000000 = _Var15.g;
            local_6d0 = _Var15.v;
            local_6c8.g = register0x00000000;
            local_6c8.v = local_6d0;
            poVar6 = operator<<(poVar6,&local_6c8);
            std::operator<<(poVar6,"\x1b[m");
          }
        }
        std::operator<<((this->super_Solver).logger," |");
        for (local_6f0._20_4_ = po_local; -1 < (int)local_6f0._20_4_;
            local_6f0._20_4_ = local_6f0._20_4_ + -1) {
          bitset::operator[]((bitset *)local_6f0,(size_t)_pe_local);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_6f0);
          local_bea = false;
          if (bVar3) {
            bitset::operator[]((bitset *)local_700,(size_t)local_820);
            local_bea = bitset::reference::operator_cast_to_bool((reference *)local_700);
          }
          if (local_bea != false) {
            bitset::operator[]((bitset *)local_710,(size_t)this_02);
            bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_710);
            if (bVar3) {
              poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;202m");
              _Var15 = Solver::label_vertex(&this->super_Solver,local_6f0._20_4_);
              local_730 = _Var15.g;
              local_728 = _Var15.v;
              local_720.g = local_730;
              local_720.v = local_728;
              poVar6 = operator<<(poVar6,&local_720);
              std::operator<<(poVar6,"\x1b[m");
            }
            else {
              poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;196m");
              _Var15 = Solver::label_vertex(&this->super_Solver,local_6f0._20_4_);
              register0x00000000 = _Var15.g;
              local_748 = _Var15.v;
              local_740.g = register0x00000000;
              local_740.v = local_748;
              poVar6 = operator<<(poVar6,&local_740);
              std::operator<<(poVar6,"\x1b[m");
            }
          }
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
        std::operator<<((this->super_Solver).logger,"\x1b[1;33mgame\x1b[m");
        lVar11 = Solver::nodecount(&this->super_Solver);
        local_768._20_4_ = (undefined4)lVar11;
        while (local_768._20_4_ = local_768._20_4_ + -1, -1 < (int)local_768._20_4_) {
          bitset::operator[]((bitset *)local_768,(size_t)&this->G);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_768);
          local_c3a = false;
          if (bVar3) {
            bitset::operator[]((bitset *)local_778,(size_t)&this->W0);
            local_c3a = bitset::reference::operator_cast_to_bool((reference *)local_778);
          }
          if (local_c3a != false) {
            poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;202m");
            _Var15 = Solver::label_vertex(&this->super_Solver,local_768._20_4_);
            register0x00000000 = _Var15.g;
            local_790 = _Var15.v;
            local_788.g = register0x00000000;
            local_788.v = local_790;
            poVar6 = operator<<(poVar6,&local_788);
            std::operator<<(poVar6,"\x1b[m");
          }
        }
        std::operator<<((this->super_Solver).logger," |");
        lVar11 = Solver::nodecount(&this->super_Solver);
        local_7b0._20_4_ = (undefined4)lVar11;
        while (local_7b0._20_4_ = local_7b0._20_4_ + -1, -1 < (int)local_7b0._20_4_) {
          bitset::operator[]((bitset *)local_7b0,(size_t)&this->G);
          bVar3 = bitset::reference::operator_cast_to_bool((reference *)local_7b0);
          local_c6a = false;
          if (bVar3) {
            bitset::operator[]((bitset *)local_7c0,(size_t)&this->W1);
            local_c6a = bitset::reference::operator_cast_to_bool((reference *)local_7c0);
          }
          if (local_c6a != false) {
            poVar6 = std::operator<<((this->super_Solver).logger," \x1b[38;5;201m");
            _Var15 = Solver::label_vertex(&this->super_Solver,local_7b0._20_4_);
            local_7d0.g = _Var15.g;
            local_7d0.v = _Var15.v;
            poVar6 = operator<<(poVar6,&local_7d0);
            std::operator<<(poVar6,"\x1b[m");
          }
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
      if ((local_610[0x1b] & 1) != 0) {
        bitset::operator-=(this_02,_pe_local);
        bitset::operator-=(_pe_local,local_820);
        bVar3 = bitset::any(_pe_local);
        if (bVar3) {
          if (pl_00 == 0) {
            solve(this,_pe_local,po_local,v,(int)local_f0._20_4_ / 2);
          }
          else {
            solve(this,_pe_local,po_local,v / 2,local_f0._20_4_);
          }
        }
      }
      v_18 = 0;
    }
    bitset::~bitset((bitset *)local_5e8);
    bitset::~bitset((bitset *)local_1b0);
  }
  return;
}

Assistant:

void
TLQSolver::solve(bitset &SG, int vtop, int pe, int po)
{
    /**
     * This is based on a universal tree of height pr/2, with parameter n associated with pe or po
     */

    iterations++;  // record the number of recursive calls (visits)

    /**
     * If precision is 0 for a player, it means we are only looking for tangles of size <= 0,
     * that is, we presume everything is won by the other player.
     */

    if (po <= 0) {
        W0 |= SG;

#ifndef NDEBUG
        if (trace>=2 and SG.any()) {
            logger << "presumed won by player 0:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        return;
    }

    if (pe <= 0) {
        W1 |= SG;

#ifndef NDEBUG
        if (trace>=2 and SG.any()) {
            logger << "presumed won by player 1:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        return;
    }

    /**
     * Move <vtop> to the true top (highest vertex that is in SG)
     */

    if (!SG[vtop]) {
        vtop = SG.find_prev(vtop);
        if (((size_t)vtop) == bitset::npos) return;
    }

    /**
     * Obtain the priority and player of the subgame
     */

    if (Ps.size() < Rs.size()) {
        Ps.push_back(priority(vtop));
        // optimisation when we enter this method for the first time!
        auto size = SG.count();
        while ((size_t)(po/2) > size) po/=2;
        while ((size_t)(pe/2) > size) pe/=2;
    }

    const int pr = Ps.back();
    const int pl = pr&1;

    /**
     * Expand the left side of the current level of the universal tree
     */

    if (pl == 0) {
        solve(SG, vtop, pe, po/2);
    } else {
        solve(SG, vtop, pe/2, po);
    }

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << std::endl;
#endif

    auto &Wm = pl == 0 ? W0 : W1; // my W
    auto &Wo = pl == 0 ? W1 : W0; // opponent's W

    /**
     * Update vtop to the highest vertex in the intersection
     */

    if (!SG[vtop]) {
        vtop = SG.find_prev(vtop);
        if (((size_t)vtop) == bitset::npos) return;
    }

    /**
     * Compute H := Attr(vertices of <pr> in <R>)
     */

    bitset H(nodecount());
    Hs.push_back(&H);

    for (int v=vtop; v!=-1; v--) {
        if (!SG[v] || H[v]) continue;
        // if (priority(v) != pr) break; // stop attracting when we reach the next priority
        if ((priority(v)&1) != pl) break; // on-the-fly compression
        heads.push_back(v);
        H[v] = true;
        str[v] = -1;
        Q.push(v);
        while (Q.nonempty()) {
            const int u = Q.pop();
            attractVertices(pl, u, H, SG, SG);
            attractTangles(pl, u, SG, H, SG);
        }
    }

#ifndef NDEBUG
    if (trace) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = H.find_last(); v != bitset::npos; v = H.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            if (trace >= 2) {
                if (owner(v) == pl) {
                    if (str[v] == -1) logger << "\033[38;5;37m\033[33m=>\033[38;5;37m-\033[m";
                    else logger << "\033[33m=>\033[38;5;37m =>" << label_vertex(str[v]) << "\033[m";
                }
            }
        }
        logger << std::endl;
    }
#endif

    /**
     * Now check if H has any escapes to R-H
     */

    bool leaky = false;
    for (auto v : heads) {
        if (!attracts(pl, v, H, SG)) {
            leaky = true;
            break;
            // TODO: consider learning tangles from partially leaky regions
        }
    }

    /**
     * If not leaky, then we can learn tangles from H
     */

    if (!leaky) {
        std::fill(pea_vidx, pea_vidx+nodecount(), '\0');
        pea_curidx = 1;
        for (auto v : heads) {
            auto T = tangles, D = dominions;
            extractTangles(v, H);
            if (D != dominions) {
                // maximize the found dominions
                for (auto v = S.find_last(); v != bitset::npos; v = S.find_prev(v)) {
                    Q.push(v);
                }
                while (Q.nonempty()) {
                    const int u = Q.pop();
                    attractVertices(pl, u, S, G, G);
                    attractTangles(pl, u, G, S, G);
                }
                // remove them from the game
                Wm |= S;
                Wo -= S;
                G -= S;
                S.reset();
            }
            if (D != dominions or T != tangles) {
                // now we need to re-maximize all regions
                for (unsigned int k=0; k<Rs.size(); k++) {
                    int k_pr = Ps[k];
                    int k_pl = k_pr & 1;
                    bitset& k_R = *Rs[k];
                    bitset& k_H = *Hs[k];
                    bitset k_U;
                    // first: R[k] - H[k] >= R[k+1]
                    // and compute what remains of k_U
                    if (k == 0) {
                        k_R &= G;
                        k_U = G - k_R;
                    } else {
                        bitset SG = *Rs[k-1] - *Hs[k-1];
                        k_R &= SG;
                        k_U = SG - k_R;
                    }
                    // maximize k_U 
                    for (auto v = k_U.find_last(); v != bitset::npos; v = k_U.find_prev(v)) {
                        Q.push(v);
                    }
                    while (Q.nonempty()) {
                        const int u = Q.pop();
                        attractVertices(1-k_pl, u, k_U, k_R, k_R);
                        attractTangles(1-k_pl, u, k_R, k_U, k_R);
                    }
                    k_R -= k_U;
                    (k_pl == 1 ? W0 : W1) |= k_U;
                    (k_pl == 1 ? W1 : W0) -= k_U;
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-R\033[m";
                        for (auto v = k_R.find_last(); v != bitset::npos; v = k_R.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-U\033[m";
                        for (auto v = k_U.find_last(); v != bitset::npos; v = k_U.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
                    // maximize H
                    k_H &= k_R;
                    for (auto v = k_H.find_last(); v != bitset::npos; v = k_H.find_prev(v)) {
                        Q.push(v);
                    }
                    while (Q.nonempty()) {
                        const int u = Q.pop();
                        attractVertices(k_pl, u, k_H, k_R, k_R);
                        attractTangles(k_pl, u, k_R, k_H, k_R);
                    }
                    (k_pl == 1 ? W1 : W0) |= k_H;
                    (k_pl == 1 ? W0 : W1) -= k_H;
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-H\033[m";
                        for (auto v = k_H.find_last(); v != bitset::npos; v = k_H.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
                }
            }
        }
    }

    heads.clear();

    // Reset Wm for vertices not in SG
    Wm -= SG;

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        // Format: Subgame: [H] | [Mine in subgame] | [Theirs in subgame] | [Earlier removed from SG]
        logger << "\033[1;33mpre subgame \033[36m" << pr << "\033[m";
        for (int v=vtop; v>=0; v--) {
            if (H[v] && !Wo[v]) logger << " \033[38;5;46m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && !H[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && Wo[v]) {
                if (Wm[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // orange -- freshly attracted
                else logger << " \033[38;5;196m" << label_vertex(v) << "\033[m"; // red
            }
        }
        logger << std::endl;
        // Format: Game [player 0] | [player 1] | [no player]
        logger << "\033[1;33mgame";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W0[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W1[v]) logger << " \033[38;5;201m" << label_vertex(v) << "\033[m"; // green
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && !W0[v] && !W1[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; // blue
        }
        logger << std::endl;
    }
#endif

    /**
     * Go recursive!
     */

    bitset R = SG ^ H;
    if (R.any()) {
        Rs.push_back(&R);
        solve(R, vtop, pe, po);
        Rs.pop_back();
        if (Ps.size() > Rs.size()) Ps.pop_back();
    }
    Hs.pop_back();

    if (SG.none()) return;

    /**
     * Let the opponent attract from our region...
     * The intersection of H and Wo is the opponent's subgame
     */

    bool opponent_attracted_from_us = false;
    for (int v=0; v<=vtop; v++) {
        if (SG[v] and Wo[v]) {
            Q.push(v);
        }
    }
    if (Q.nonempty()) {
        while (Q.nonempty()) {
            const int v = Q.pop();
            if (Wm[v]) opponent_attracted_from_us = true;
            attractVertices(1-pl, v, Wo, SG, SG);
            attractTangles(1-pl, v, SG, Wo, SG);
        }
    }

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        // Format: Subgame: [H] | [Mine in subgame] | [Theirs in subgame] | [Earlier removed from SG]
        logger << "\033[1;33mpost subgame \033[36m" << pr << "\033[m (pe=" << pe << " po=" << po << ")";
        for (int v=vtop; v>=0; v--) {
            if (H[v] && !Wo[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; // blueish
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && !H[v] && !Wo[v]) logger << " \033[38;5;46m" << label_vertex(v) << "\033[m"; // green
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && Wo[v]) {
                if (Wm[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // orange -- freshly attracted
                else logger << " \033[38;5;196m" << label_vertex(v) << "\033[m"; // red
            }
        }
        logger << std::endl;
        // Format: Game [player 0] | [player 1] | [no player]
        logger << "\033[1;33mgame\033[m";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W0[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // blueish
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W1[v]) logger << " \033[38;5;201m" << label_vertex(v) << "\033[m"; // green
        }
        logger << std::endl;
    }
#endif

    /**
     * Finally, if the opponent attracted from us, then we do the right side of the universal tree.
     * Also only do this if there is anything remaining in the subgame.
     */

    if (opponent_attracted_from_us) {
        Wm -= SG;  // reset Wm prior to recursion
        SG -= Wo;  // remove opponent won vertices from subgame

        if (SG.any()) {
            // Expand the right side of the current level of the universal tree
            if (pl == 0) solve(SG, vtop, pe, po/2);
            else solve(SG, vtop, pe/2, po);
        }
    }
}